

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O3

void duckdb_je_buf_writer_cb(void *buf_writer_arg,char *s)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong __n;
  ulong uVar5;
  
  if (*(long *)((long)buf_writer_arg + 0x10) != 0) {
    sVar1 = strlen(s);
    if (sVar1 != 0) {
      lVar2 = *(long *)((long)buf_writer_arg + 0x20);
      uVar5 = 0;
      do {
        lVar3 = *(long *)((long)buf_writer_arg + 0x10);
        lVar4 = *(long *)((long)buf_writer_arg + 0x18);
        if (lVar2 == *(long *)((long)buf_writer_arg + 0x18)) {
          if (lVar3 == 0) {
            lVar3 = 0;
            lVar4 = lVar2;
          }
          else {
            *(undefined1 *)(lVar3 + lVar2) = 0;
            (**buf_writer_arg)(*(undefined8 *)((long)buf_writer_arg + 8),
                               *(undefined8 *)((long)buf_writer_arg + 0x10));
            *(undefined8 *)((long)buf_writer_arg + 0x20) = 0;
            lVar3 = *(long *)((long)buf_writer_arg + 0x10);
            lVar2 = 0;
            lVar4 = *(long *)((long)buf_writer_arg + 0x18);
          }
        }
        __n = lVar4 - lVar2;
        if (sVar1 - uVar5 < (ulong)(lVar4 - lVar2)) {
          __n = sVar1 - uVar5;
        }
        switchD_012b9b0d::default((void *)(lVar3 + lVar2),s + uVar5,__n);
        lVar2 = *(long *)((long)buf_writer_arg + 0x20) + __n;
        *(long *)((long)buf_writer_arg + 0x20) = lVar2;
        uVar5 = uVar5 + __n;
      } while (uVar5 < sVar1);
    }
    return;
  }
  (**buf_writer_arg)(*(undefined8 *)((long)buf_writer_arg + 8),s);
  return;
}

Assistant:

void
buf_writer_cb(void *buf_writer_arg, const char *s) {
	buf_writer_t *buf_writer = (buf_writer_t *)buf_writer_arg;
	buf_writer_assert(buf_writer);
	if (buf_writer->buf == NULL) {
		buf_writer->write_cb(buf_writer->cbopaque, s);
		return;
	}
	size_t i, slen, n;
	for (i = 0, slen = strlen(s); i < slen; i += n) {
		if (buf_writer->buf_end == buf_writer->buf_size) {
			buf_writer_flush(buf_writer);
		}
		size_t s_remain = slen - i;
		size_t buf_remain = buf_writer->buf_size - buf_writer->buf_end;
		n = s_remain < buf_remain ? s_remain : buf_remain;
		memcpy(buf_writer->buf + buf_writer->buf_end, s + i, n);
		buf_writer->buf_end += n;
		buf_writer_assert(buf_writer);
	}
	assert(i == slen);
}